

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

void __thiscall
Protocol::MQTT::V5::PayloadWithData<false>::dump
          (PayloadWithData<false> *this,FastString *out,int indent)

{
  undefined4 in_register_00000014;
  uint32 i;
  ulong uVar1;
  String local_40;
  
  MQTTStringPrintf((char *)&local_40,"%*sPayload (length: %u)",CONCAT44(in_register_00000014,indent)
                   ,"",(ulong)this->size);
  Bstrlib::String::operator+=(out,&local_40);
  Bstrlib::String::~String(&local_40);
  for (uVar1 = 0; uVar1 < this->size; uVar1 = uVar1 + 1) {
    if ((uVar1 & 0xf) == 0) {
      MQTTStringPrintf((char *)&local_40,"\n%*s",(ulong)(indent + 2),"");
      Bstrlib::String::operator+=(out,&local_40);
      Bstrlib::String::~String(&local_40);
    }
    MQTTStringPrintf((char *)&local_40,"%02X ",(ulong)this->data[uVar1]);
    Bstrlib::String::operator+=(out,&local_40);
    Bstrlib::String::~String(&local_40);
  }
  Bstrlib::String::operator+=(out,"\n");
  return;
}

Assistant:

void dump(MQTTString & out, const int indent = 0)
                {
                    out += MQTTStringPrintf("%*sPayload (length: %u)", (int)indent, "", size);
                    for (uint32 i = 0; i < size; i++)
                    {
                        if (!(i%16)) out+= MQTTStringPrintf("\n%*s", (int)indent + 2, "");
                        out += MQTTStringPrintf("%02X ", data[i]);
                    }
                    out += "\n";
                 }